

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::torrent::choke_peer(torrent *this,peer_connection *c)

{
  bool bVar1;
  
  bVar1 = peer_connection::send_choke(c);
  if (bVar1) {
    *(uint *)&this->field_0x5d8 =
         *(uint *)&this->field_0x5d8 & 0xff000000 | *(uint *)&this->field_0x5d8 - 1 & 0xffffff;
    state_updated(this);
  }
  return bVar1;
}

Assistant:

bool torrent::choke_peer(peer_connection& c)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(!c.is_choked());
		TORRENT_ASSERT(!c.ignore_unchoke_slots());
		TORRENT_ASSERT(m_num_uploads > 0);
		if (!c.send_choke()) return false;
		--m_num_uploads;
		state_updated();
		return true;
	}